

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void import_append_char(ImportCtx *p,int c)

{
  int iVar1;
  void *pvVar2;
  undefined4 in_ESI;
  long in_RDI;
  sqlite3_uint64 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x24) <= *(int *)(in_RDI + 0x20) + 1) {
    *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) + 100 + *(int *)(in_RDI + 0x24);
    pvVar2 = duckdb_shell_sqlite3_realloc64
                       ((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8
                       );
    *(void **)(in_RDI + 0x18) = pvVar2;
    if (*(long *)(in_RDI + 0x18) == 0) {
      shell_out_of_memory();
    }
  }
  iVar1 = *(int *)(in_RDI + 0x20);
  *(int *)(in_RDI + 0x20) = iVar1 + 1;
  *(char *)(*(long *)(in_RDI + 0x18) + (long)iVar1) = (char)in_ESI;
  return;
}

Assistant:

static void import_append_char(ImportCtx *p, int c) {
	if (p->n + 1 >= p->nAlloc) {
		p->nAlloc += p->nAlloc + 100;
		p->z = (char *)sqlite3_realloc64(p->z, p->nAlloc);
		if (p->z == 0)
			shell_out_of_memory();
	}
	p->z[p->n++] = (char)c;
}